

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O1

uint64_t helper_psubb_mips64el(uint64_t fs,uint64_t ft)

{
  long lVar1;
  LMIValue vs;
  LMIValue vt;
  
  vs.d = fs;
  vt.d = ft;
  lVar1 = 0;
  do {
    vs.ub[lVar1] = vs.ub[lVar1] - vt.ub[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  return vs.d;
}

Assistant:

uint64_t helper_psubb(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned int i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 8; ++i) {
        vs.ub[i] -= vt.ub[i];
    }
    return vs.d;
}